

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O3

int sprkStep_TakeStep_Compensated(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  double dVar1;
  double dVar2;
  long *plVar3;
  N_Vector p_Var4;
  N_Vector p_Var5;
  N_Vector p_Var6;
  int iVar7;
  long lVar8;
  int iVar9;
  int error_code;
  char *msgfmt;
  long lVar10;
  double local_68;
  double local_60;
  
  plVar3 = (long *)ark_mem->step_mem;
  if (plVar3 == (long *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar9 = -0x15;
    error_code = -0x15;
    iVar7 = 0x32b;
LAB_0015ff46:
    arkProcessError(ark_mem,error_code,iVar7,"sprkStep_TakeStep_Compensated",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,msgfmt);
  }
  else {
    p_Var4 = ark_mem->tempv1;
    p_Var5 = ark_mem->tempv2;
    p_Var6 = ark_mem->tempv3;
    local_68 = 0.0;
    N_VConst(p_Var4);
    lVar8 = *plVar3;
    if (0 < *(int *)(lVar8 + 4)) {
      lVar10 = 0;
      local_60 = 0.0;
      do {
        dVar1 = *(double *)(*(long *)(lVar8 + 8) + lVar10 * 8);
        dVar2 = *(double *)(*(long *)(lVar8 + 0x10) + lVar10 * 8);
        local_68 = local_68 + dVar2;
        *(int *)(plVar3 + 8) = (int)lVar10;
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var4,p_Var5);
        N_VConst(0,plVar3[2]);
        iVar7 = (*(code *)plVar3[4])
                          (ark_mem->h * local_68 + ark_mem->tn,p_Var5,plVar3[2],ark_mem->user_data);
        plVar3[6] = plVar3[6] + 1;
        if (iVar7 != 0) {
          return -8;
        }
        local_60 = local_60 + dVar1;
        N_VLinearSum(0x3ff0000000000000,dVar2 * ark_mem->h,p_Var4,plVar3[2],p_Var4);
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var4,p_Var5);
        ark_mem->tcur = ark_mem->h * local_68 + ark_mem->tn;
        N_VConst(0,plVar3[2]);
        iVar7 = (*(code *)plVar3[5])
                          (ark_mem->h * local_60 + ark_mem->tn,p_Var5,plVar3[2],ark_mem->user_data);
        plVar3[7] = plVar3[7] + 1;
        if (iVar7 != 0) {
          return -8;
        }
        N_VLinearSum(0x3ff0000000000000,dVar1 * ark_mem->h,p_Var4,plVar3[2],p_Var4);
        if (ark_mem->ProcessStage != (ARKPostProcessFn)0x0) {
          msgfmt = "Compensated summation is not compatible with stage PostProcessing!\n";
          iVar9 = -0x26;
          error_code = -0x26;
          iVar7 = 0x2e3;
          goto LAB_0015ff46;
        }
        lVar10 = lVar10 + 1;
        lVar8 = *plVar3;
      } while (lVar10 < *(int *)(lVar8 + 4));
    }
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,p_Var4,plVar3[3],p_Var4);
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var4,ark_mem->ycur);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->ycur,ark_mem->yn,p_Var6);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,p_Var6,p_Var4,plVar3[3]);
    *nflagPtr = 0;
    *dsmPtr = 0.0;
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int sprkStep_TakeStep_Compensated(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                  int* nflagPtr)
{
  ARKodeSPRKStepMem step_mem = NULL;
  N_Vector delta_Yi          = NULL;
  N_Vector yn_plus_delta_Yi  = NULL;
  N_Vector diff              = NULL;
  sunrealtype ci             = SUN_RCONST(0.0);
  sunrealtype chati          = SUN_RCONST(0.0);
  int is                     = 0;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Vector shortcuts */
  delta_Yi         = ark_mem->tempv1;
  yn_plus_delta_Yi = ark_mem->tempv2;
  diff             = ark_mem->tempv3;

  /* [ \Delta P_0 ] = [ 0 ]
     [ \Delta Q_0 ] = [ 0 ] */
  N_VConst(ZERO, delta_Yi);

  /* loop over internal stages to the step */
  for (is = 0; is < step_mem->method->stages; is++)
  {
    /* load/compute coefficients */
    sunrealtype ai    = step_mem->method->a[is];
    sunrealtype ahati = step_mem->method->ahat[is];

    ci += ai;
    chati += ahati;

    /* store current stage index */
    step_mem->istage = is;

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, t = " SUN_FORMAT_G ", that = " SUN_FORMAT_G, is,
               ark_mem->tn + ci * ark_mem->h, ark_mem->tn + chati * ark_mem->h);

    /* [     ] + [            ]
       [ q_n ] + [ \Delta Q_i ] */
    N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, yn_plus_delta_Yi);

    SUNLogExtraDebugVec(ARK_LOGGER, "stage", yn_plus_delta_Yi, "z2_%i(:) =", is);

    /* Evaluate p' with the previous velocity */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f1(step_mem, ark_mem->tn + chati * ark_mem->h,
                         yn_plus_delta_Yi, step_mem->sdata, ark_mem->user_data);

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", step_mem->sdata,
                        "f1_%i(:) =", is);

    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }

    /* Incremental position update:
       [ \Delta P_i ] = [ \Delta P_{i-1} ] + [ sdata ]
       [            ] = [                ] + [       ] */
    N_VLinearSum(ONE, delta_Yi, ark_mem->h * ahati, step_mem->sdata, delta_Yi);

    /* [ p_n ] + [ \Delta P_i ]
       [     ] + [            ] */
    N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, yn_plus_delta_Yi);

    SUNLogExtraDebugVec(ARK_LOGGER, "stage", yn_plus_delta_Yi, "z1_%i(:) =", is);

    /* set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + chati * ark_mem->h;

    /* Evaluate q' with the current positions */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f2(step_mem, ark_mem->tn + ci * ark_mem->h,
                         yn_plus_delta_Yi, step_mem->sdata, ark_mem->user_data);

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", step_mem->sdata,
                        "f2_%i(:) =", is);

    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }

    /* Incremental velocity update:
       [            ] = [                ] + [       ]
       [ \Delta Q_i ] = [ \Delta Q_{i-1} ] + [ sdata ] */
    N_VLinearSum(ONE, delta_Yi, ark_mem->h * ai, step_mem->sdata, delta_Yi);

    /* if user-supplied stage postprocessing function, we error out since it
     * won't work with the increment form */
    if (ark_mem->ProcessStage != NULL)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      arkProcessError(ark_mem, ARK_POSTPROCESS_STAGE_FAIL, __LINE__, __func__,
                      __FILE__,
                      "Compensated summation is not compatible with stage "
                      "PostProcessing!\n");
      return (ARK_POSTPROCESS_STAGE_FAIL);
    }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  }

  /*
    Now we compute the step solution via compensated summation.
     [ p_{n+1} ] = [ p_n ] + [ \Delta P_i ]
     [ q_{n+1} ] = [ q_n ] + [ \Delta Q_i ] */
  N_VLinearSum(ONE, delta_Yi, -ONE, step_mem->yerr, delta_Yi);
  N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, ark_mem->ycur);
  N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->yn, diff);
  N_VLinearSum(ONE, diff, -ONE, delta_Yi, step_mem->yerr);

  *nflagPtr = 0;
  *dsmPtr   = SUN_RCONST(0.0);

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  return 0;
}